

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

void __thiscall packing::ProtoPalAttrs::banFrom(ProtoPalAttrs *this,size_t index)

{
  _Bit_type *p_Var1;
  size_t sVar2;
  
  p_Var1 = (this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 <=
      index) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->bannedPages,index + 1,false);
    p_Var1 = (this->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  sVar2 = index + 0x3f;
  if (-1 < (long)index) {
    sVar2 = index;
  }
  p_Var1[((long)sVar2 >> 6) +
         (ulong)((index & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
       p_Var1[((long)sVar2 >> 6) +
              (ulong)((index & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
       1L << ((byte)index & 0x3f);
  return;
}

Assistant:

void banFrom(size_t index) {
		if (bannedPages.size() <= index) {
			bannedPages.resize(index + 1);
		}
		bannedPages[index] = true;
	}